

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  uint16_t *puVar1;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ptls_iovec_t ikm;
  int iVar2;
  void *pvVar3;
  uint8_t *msg;
  uint16_t *in_RCX;
  ptls_iovec_t *in_RDX;
  ulong *in_RSI;
  ptls_iovec_t *in_RDI;
  uint64_t *in_R8;
  bool bVar4;
  ptls_iovec_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  ptls_key_exchange_algorithm_t **a;
  int64_t delta;
  int can_accept_early_data;
  st_ptls_client_hello_psk_t *identity;
  int ret;
  uint8_t binder_key [64];
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  uint32_t age_add;
  uint64_t now;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  ptls_buffer_t decbuf;
  void *in_stack_fffffffffffffed8;
  ptls_buffer_t *in_stack_fffffffffffffee0;
  char *y;
  ptls_key_schedule_t *in_stack_fffffffffffffef0;
  ptls_buffer_t *in_stack_ffffffffffffff00;
  long local_f8;
  uint in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  ptls_key_schedule_t *in_stack_ffffffffffffff30;
  ptls_key_schedule_t *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  short in_stack_ffffffffffffff68;
  short in_stack_ffffffffffffff6a;
  int in_stack_ffffffffffffff6c;
  void *in_stack_ffffffffffffff78;
  ptls_key_schedule_t *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  long local_68;
  long local_58;
  char *local_50 [2];
  long local_40;
  uint16_t *in_stack_ffffffffffffffc8;
  
  pvVar3 = (void *)(*(code *)**(undefined8 **)(in_RDI->base + 8))(*(undefined8 *)(in_RDI->base + 8))
  ;
  ptls_buffer_init(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0x1294aa);
  *in_RSI = 0;
  do {
    if (*(ulong *)(in_RCX + 0x1a0) <= *in_RSI) {
      *in_RSI = 0xffffffffffffffff;
      *(undefined4 *)&in_RDX->base = 0;
      in_RDI[0x11].len = 0;
      iVar2 = 0;
LAB_001299c2:
      ptls_buffer_dispose(in_stack_ffffffffffffff00);
      (*ptls_clear_memory)(&stack0xffffffffffffff28,0x40);
      return iVar2;
    }
    puVar1 = in_RCX + *in_RSI * 0x14 + 0x150;
    bVar4 = true;
    local_40 = 0;
    iVar2 = (*(code *)**(undefined8 **)(in_RDI->base + 0x78))
                      (*(undefined8 **)(in_RDI->base + 0x78),in_RDI,0,local_50,*(undefined8 *)puVar1
                       ,*(undefined8 *)(puVar1 + 4));
    if (iVar2 == 0) {
LAB_00129565:
      msg = (uint8_t *)(local_50[0] + local_40);
      y = local_50[0];
      iVar2 = decode_session_identifier
                        (in_R8,in_RDI,(uint32_t *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffc8,
                         unaff_retaddr,in_stack_00000008,in_stack_00000010);
      if (((iVar2 == 0) && (in_stack_ffffffffffffff78 <= pvVar3)) &&
         ((ulong)((long)pvVar3 - (long)in_stack_ffffffffffffff78) <=
          (ulong)*(uint *)(in_RDI->base + 0x58) * 1000)) {
        *(undefined4 *)&in_RDX->base = 0;
        if (((in_RCX[0x1a6] & 1) != 0) && (bVar4)) {
          local_f8 = (long)pvVar3 +
                     (-(ulong)(uint)(*(int *)(puVar1 + 8) - in_stack_ffffffffffffff6c) -
                     (long)in_stack_ffffffffffffff78);
          if (local_f8 < 0) {
            local_f8 = -local_f8;
          }
          if ((*(int *)(in_RDI->base + 0x5c) != 0) && (local_f8 < 0x2711)) {
            *(undefined4 *)&in_RDX->base = 1;
          }
        }
        if (local_68 == 0) {
          if (in_RDI[0x10].len == 0) goto LAB_00129719;
        }
        else if ((in_RDI[0x10].len != 0) &&
                (x.len = (size_t)in_stack_fffffffffffffef0, x.base = msg, iVar2 = vec_is_string(x,y)
                , iVar2 != 0)) {
LAB_00129719:
          in_stack_ffffffffffffff00 = *(ptls_buffer_t **)(in_RDI->base + 0x10);
          while( true ) {
            bVar4 = false;
            if (in_stack_ffffffffffffff00->base != (uint8_t *)0x0) {
              bVar4 = *(short *)in_stack_ffffffffffffff00->base != in_stack_ffffffffffffff6a;
            }
            if (!bVar4) break;
            in_stack_ffffffffffffff00 = (ptls_buffer_t *)&in_stack_ffffffffffffff00->capacity;
          }
          if (((((in_stack_ffffffffffffff00->base != (uint8_t *)0x0) &&
                (in_RDI[0x11].len = (size_t)in_stack_ffffffffffffff00->base,
                in_stack_ffffffffffffff68 == *(short *)in_RDI[0x12].base)) &&
               ((in_stack_ffffffffffffff88 == (void *)0x0 ||
                ((in_RDI[0x11].base != (uint8_t *)0x0 &&
                 (x_00.len = (size_t)in_stack_fffffffffffffef0, x_00.base = msg,
                 iVar2 = vec_is_string(x_00,y), iVar2 != 0)))))) &&
              (local_58 == *(long *)(*(long *)(in_RDI[5].base + 0x58) + 8))) &&
             (*(long *)(in_RCX + *in_RSI * 0x14 + 0x160) ==
              *(long *)(*(long *)(in_RDI[5].base + 0x58) + 8))) {
            ikm.len._0_2_ = in_stack_ffffffffffffff68;
            ikm.base = (uint8_t *)in_stack_ffffffffffffff60;
            ikm.len._2_2_ = in_stack_ffffffffffffff6a;
            ikm.len._4_4_ = in_stack_ffffffffffffff6c;
            iVar2 = key_schedule_extract(in_stack_ffffffffffffff58,ikm);
            if ((iVar2 == 0) &&
               (iVar2 = derive_secret(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                      (char *)(ulong)in_stack_ffffffffffffff20), iVar2 == 0)) {
              ptls__key_schedule_update_hash(in_stack_fffffffffffffef0,msg,(size_t)y);
              iVar2 = calc_verify_data(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                       in_stack_ffffffffffffff78);
              if (iVar2 == 0) {
                iVar2 = (*ptls_mem_equal)(*(void **)(in_RCX + *in_RSI * 0x14 + 0x15c),
                                          &stack0xffffffffffffff28,
                                          *(size_t *)(*(long *)(in_RDI[5].base + 0x58) + 8));
                if (iVar2 == 0) {
                  iVar2 = 0x33;
                }
                else {
                  iVar2 = 0;
                }
              }
            }
            goto LAB_001299c2;
          }
        }
      }
    }
    else if (iVar2 == 0x209) {
      bVar4 = false;
      goto LAB_00129565;
    }
    *in_RSI = *in_RSI + 1;
  } while( true );
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        int can_accept_early_data = 1;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}